

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
          (iterator *__return_storage_ptr__,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this)

{
  btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *this_00;
  reference ppVar1;
  NodeBase *entry;
  uint uVar2;
  iterator iVar3;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
  local_28;
  
  uVar2 = (this->super_KeyMapBase<google::protobuf::MapKey>).super_UntypedMapBase.
          index_of_first_non_null_;
  if (uVar2 == (this->super_KeyMapBase<google::protobuf::MapKey>).super_UntypedMapBase.num_buckets_)
  {
    entry = (NodeBase *)0x0;
    uVar2 = 0;
  }
  else {
    entry = (NodeBase *)
            (this->super_KeyMapBase<google::protobuf::MapKey>).super_UntypedMapBase.table_[uVar2];
    if (((ulong)entry & 1) != 0) {
      this_00 = (btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                 *)internal::TableEntryToTree((TableEntryPtr)entry);
      iVar3 = absl::lts_20240722::container_internal::
              btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
              ::begin(this_00);
      local_28.node_ = iVar3.node_;
      local_28.position_ = iVar3.position_;
      ppVar1 = absl::lts_20240722::container_internal::
               btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
               ::operator*(&local_28);
      entry = ppVar1->second;
    }
    if (entry == (NodeBase *)0x0) {
      internal::protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/map.h"
                 ,0x33d);
    }
  }
  (__return_storage_ptr__->super_UntypedMapIterator).node_ = entry;
  (__return_storage_ptr__->super_UntypedMapIterator).m_ = (UntypedMapBase *)this;
  (__return_storage_ptr__->super_UntypedMapIterator).bucket_index_ = uVar2;
  return __return_storage_ptr__;
}

Assistant:

iterator begin() ABSL_ATTRIBUTE_LIFETIME_BOUND {
    return iterator(Base::begin());
  }